

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O3

bool isJitEnabled(void)

{
  int iVar1;
  byte bVar2;
  long in_FS_OFFSET;
  bool ok;
  bool local_29;
  QByteArray local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  qgetenv(&local_28,"QT_ENABLE_REGEXP_JIT");
  if ((undefined1 *)local_28.d.size == (undefined1 *)0x0) {
    bVar2 = 1;
  }
  else {
    local_29 = true;
    iVar1 = QByteArray::toInt(&local_28,&local_29,10);
    bVar2 = local_29 ^ 1U | iVar1 != 0;
  }
  if (&(local_28.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_28.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (bool)bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool isJitEnabled()
{
    QByteArray jitEnvironment = qgetenv("QT_ENABLE_REGEXP_JIT");
    if (!jitEnvironment.isEmpty()) {
        bool ok;
        int enableJit = jitEnvironment.toInt(&ok);
        return ok ? (enableJit != 0) : true;
    }

#ifdef QT_DEBUG
    return false;
#elif defined(Q_OS_MACOS) && !defined(QT_BOOTSTRAPPED)
    return !qt_mac_runningUnderRosetta();
#else
    return true;
#endif
}